

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDImporter.cpp
# Opt level: O0

void __thiscall Assimp::MMDImporter::MMDImporter(MMDImporter *this)

{
  char cVar1;
  undefined1 local_48 [8];
  DefaultIOSystem io;
  allocator local_11;
  MMDImporter *local_10;
  MMDImporter *this_local;
  
  local_10 = this;
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_0111b410;
  *(undefined8 *)&(this->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl = 0;
  *(undefined8 *)&(this->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8
       = 0;
  *(undefined8 *)
   &(this->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10 = 0;
  std::vector<char,_std::allocator<char>_>::vector(&this->m_Buffer);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->m_strAbsPath,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  DefaultIOSystem::DefaultIOSystem((DefaultIOSystem *)local_48);
  cVar1 = DefaultIOSystem::getOsSeparator((DefaultIOSystem *)local_48);
  std::__cxx11::string::operator=((string *)&this->m_strAbsPath,cVar1);
  DefaultIOSystem::~DefaultIOSystem((DefaultIOSystem *)local_48);
  return;
}

Assistant:

MMDImporter::MMDImporter()
: m_Buffer()
, m_strAbsPath("") {
    DefaultIOSystem io;
    m_strAbsPath = io.getOsSeparator();
}